

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

Point2f __thiscall pbrt::PMJ02BNSampler::Get2D(PMJ02BNSampler *this)

{
  int iVar1;
  int sampleIndex;
  uint64_t uVar2;
  float fVar3;
  undefined1 auVar5 [16];
  Point2f PVar4;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined8 extraout_XMM0_Qb;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined1 extraout_var [60];
  
  iVar1 = this->dimension;
  if ((long)iVar1 < 10) {
    sampleIndex = this->sampleIndex;
  }
  else {
    uVar2 = MixBits((long)this->seed ^
                    (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.y << 0x20 ^
                    ((long)iVar1 << 0x10 |
                    (ulong)(uint)(this->pixel).super_Tuple2<pbrt::Point2,_int>.x << 0x30));
    sampleIndex = PermutationElement(this->sampleIndex,this->samplesPerPixel,(uint32_t)uVar2);
  }
  PVar4 = GetPMJ02BNSample(iVar1 / 2,sampleIndex);
  fVar3 = BlueNoise(this->dimension,(Point2i)(this->pixel).super_Tuple2<pbrt::Point2,_int>);
  auVar6._0_4_ = BlueNoise(this->dimension + 1,
                           (Point2i)(this->pixel).super_Tuple2<pbrt::Point2,_int>);
  auVar6._4_60_ = extraout_var;
  auVar5._4_4_ = extraout_XMM0_Db;
  auVar5._0_4_ = fVar3;
  auVar5._8_4_ = extraout_XMM0_Dc;
  auVar5._12_4_ = extraout_XMM0_Dd;
  auVar5 = vinsertps_avx(auVar5,auVar6._0_16_,0x10);
  local_28 = PVar4.super_Tuple2<pbrt::Point2,_float>.x;
  fStack_24 = PVar4.super_Tuple2<pbrt::Point2,_float>.y;
  fStack_20 = (float)extraout_XMM0_Qb;
  fStack_1c = (float)((ulong)extraout_XMM0_Qb >> 0x20);
  auVar8._0_4_ = auVar5._0_4_ + local_28;
  auVar8._4_4_ = auVar5._4_4_ + fStack_24;
  auVar8._8_4_ = auVar5._8_4_ + fStack_20;
  auVar8._12_4_ = auVar5._12_4_ + fStack_1c;
  auVar5 = auVar8;
  if (1.0 <= auVar8._0_4_) {
    auVar5 = ZEXT416((uint)(auVar8._0_4_ + -1.0));
  }
  auVar8 = vmovshdup_avx(auVar8);
  if (1.0 <= auVar8._0_4_) {
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)(auVar8._0_4_ + -1.0)),0x10);
  }
  auVar7._8_4_ = 0x3f7fffff;
  auVar7._0_8_ = 0x3f7fffff3f7fffff;
  auVar7._12_4_ = 0x3f7fffff;
  this->dimension = this->dimension + 2;
  auVar5 = vminps_avx(auVar7,auVar5);
  return (Point2f)auVar5._0_8_;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        // Compute index for 2D pmj02bn sample
        int index = sampleIndex;
        int pmjInstance = dimension / 2;
        if (pmjInstance >= nPMJ02bnSets) {
            // Permute index to be used for pmj02bn sample array
            uint64_t hash =
                MixBits(((uint64_t)pixel.x << 48) ^ ((uint64_t)pixel.y << 32) ^
                        ((uint64_t)dimension << 16) ^ seed);
            index = PermutationElement(sampleIndex, samplesPerPixel, hash);
        }

        // Return randomized pmj02bn sample for current dimension
        Point2f u = GetPMJ02BNSample(pmjInstance, index);
        // Apply Cranley-Patterson rotation to pmj02bn sample _u_
        u += Vector2f(BlueNoise(dimension, pixel), BlueNoise(dimension + 1, pixel));
        if (u.x >= 1)
            u.x -= 1;
        if (u.y >= 1)
            u.y -= 1;

        dimension += 2;
        return {std::min(u.x, OneMinusEpsilon), std::min(u.y, OneMinusEpsilon)};
    }